

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall cmExtraSublimeTextGenerator::Generate(cmExtraSublimeTextGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE",
             (allocator<char> *)&local_38);
  bVar2 = cmGlobalGenerator::GlobalSettingIsOn(pcVar1,&local_58);
  this->ExcludeBuildFolder = bVar2;
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS",&local_59);
  cmGlobalGenerator::GetSafeGlobalSetting(&local_58,pcVar1,&local_38);
  std::__cxx11::string::operator=((string *)&this->EnvSettings,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  for (p_Var3 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var3 + 2));
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::Generate()
{
  this->ExcludeBuildFolder = this->GlobalGenerator->GlobalSettingIsOn(
    "CMAKE_SUBLIME_TEXT_2_EXCLUDE_BUILD_TREE");
  this->EnvSettings = this->GlobalGenerator->GetSafeGlobalSetting(
    "CMAKE_SUBLIME_TEXT_2_ENV_SETTINGS");

  // for each sub project in the project create a sublime text 2 project
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // create a project file
    this->CreateProjectFile(it.second);
  }
}